

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

PermuteLayerParams * __thiscall
CoreML::Specification::PermuteLayerParams::New(PermuteLayerParams *this,Arena *arena)

{
  PermuteLayerParams *this_00;
  
  this_00 = (PermuteLayerParams *)operator_new(0x28);
  PermuteLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::PermuteLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

PermuteLayerParams* PermuteLayerParams::New(::google::protobuf::Arena* arena) const {
  PermuteLayerParams* n = new PermuteLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}